

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenAddGlobalImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,BinaryenType globalType,bool mutable_)

{
  undefined4 uVar1;
  Global *pGVar2;
  undefined3 in_register_00000089;
  string_view local_68;
  BinaryenType local_58;
  Name local_50;
  undefined4 local_3c;
  _Head_base<0UL,_wasm::Global_*,_false> local_38;
  __single_object glob;
  
  local_3c = CONCAT31(in_register_00000089,mutable_);
  local_58 = globalType;
  wasm::Name::Name((Name *)&local_68,internalName);
  pGVar2 = wasm::Module::getGlobalOrNull(module,(Name)local_68);
  uVar1 = local_3c;
  if (pGVar2 == (Global *)0x0) {
    std::make_unique<wasm::Global>();
    wasm::Name::Name(&local_50,internalName);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         local_50.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         local_50.super_IString.str._M_str;
    wasm::Name::Name(&local_50,externalModuleName);
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         local_50.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str =
         local_50.super_IString.str._M_str;
    wasm::Name::Name(&local_50,externalBaseName);
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         local_50.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str =
         local_50.super_IString.str._M_str;
    ((local_38._M_head_impl)->type).id = local_58;
    (local_38._M_head_impl)->mutable_ = SUB41(uVar1,0);
    wasm::Module::addGlobal
              (module,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_38);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
              ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_38);
  }
  else {
    wasm::Name::Name(&local_50,externalModuleName);
    (pGVar2->super_Importable).module.super_IString.str._M_len = local_50.super_IString.str._M_len;
    (pGVar2->super_Importable).module.super_IString.str._M_str = local_50.super_IString.str._M_str;
    wasm::Name::Name(&local_50,externalBaseName);
    (pGVar2->super_Importable).base.super_IString.str._M_len = local_50.super_IString.str._M_len;
    (pGVar2->super_Importable).base.super_IString.str._M_str = local_50.super_IString.str._M_str;
  }
  return;
}

Assistant:

void BinaryenAddGlobalImport(BinaryenModuleRef module,
                             const char* internalName,
                             const char* externalModuleName,
                             const char* externalBaseName,
                             BinaryenType globalType,
                             bool mutable_) {
  auto* glob = ((Module*)module)->getGlobalOrNull(internalName);
  if (glob == nullptr) {
    auto glob = std::make_unique<Global>();
    glob->name = internalName;
    glob->module = externalModuleName;
    glob->base = externalBaseName;
    glob->type = Type(globalType);
    glob->mutable_ = mutable_;
    ((Module*)module)->addGlobal(std::move(glob));
  } else {
    // already exists so just set module and base
    glob->module = externalModuleName;
    glob->base = externalBaseName;
  }
}